

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev_dfg.c
# Opt level: O2

void handle_deploy_ack(EVmaster master,EVmaster_msg_ptr mmsg)

{
  CManager cm;
  EVdfg p_Var1;
  int iVar2;
  __pid_t _Var3;
  pthread_t pVar4;
  char *pcVar5;
  char *__format;
  FILE *pFVar6;
  timespec ts;
  
  cm = master->cm;
  p_Var1 = master->dfg;
  p_Var1->deploy_ack_count = p_Var1->deploy_ack_count + 1;
  iVar2 = CMtrace_val[0xd];
  if (cm->CMTrace_file == (FILE *)0x0) {
    iVar2 = CMtrace_init(cm,EVdfgVerbose);
  }
  if (iVar2 != 0) {
    if (CMtrace_PID != 0) {
      pFVar6 = (FILE *)cm->CMTrace_file;
      _Var3 = getpid();
      pVar4 = pthread_self();
      fprintf(pFVar6,"P%lxT%lx - ",(long)_Var3,pVar4);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,(timespec *)&ts);
      fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
    }
    fprintf((FILE *)cm->CMTrace_file,"Client %s reports deployed, count %d\n",
            (mmsg->u).node_join.node_name,(ulong)(uint)master->dfg->deploy_ack_count);
  }
  fflush((FILE *)cm->CMTrace_file);
  if (master->dfg->deploy_ack_count == p_Var1->master->node_count) {
    if (p_Var1->deploy_ack_condition == -1) {
      if (master->state != DFG_Reconfiguring) goto LAB_00146ffd;
      master->state = DFG_Running;
      iVar2 = CMtrace_val[0xd];
      if (cm->CMTrace_file == (FILE *)0x0) {
        iVar2 = CMtrace_init(cm,EVdfgVerbose);
      }
      if (iVar2 != 0) {
        if (CMtrace_PID != 0) {
          pFVar6 = (FILE *)cm->CMTrace_file;
          _Var3 = getpid();
          pVar4 = pthread_self();
          fprintf(pFVar6,"P%lxT%lx - ",(long)_Var3,pVar4);
        }
        if (CMtrace_timing != 0) {
          clock_gettime(1,(timespec *)&ts);
          fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
        }
        pFVar6 = (FILE *)cm->CMTrace_file;
        pcVar5 = str_state[master->state];
        __format = "EVDFG after reconfiguration -  master DFG state set to %s\n";
        goto LAB_00146fea;
      }
    }
    else {
      iVar2 = CMtrace_val[0xd];
      if (cm->CMTrace_file == (FILE *)0x0) {
        iVar2 = CMtrace_init(cm,EVdfgVerbose);
      }
      if (iVar2 != 0) {
        if (CMtrace_PID != 0) {
          pFVar6 = (FILE *)cm->CMTrace_file;
          _Var3 = getpid();
          pVar4 = pthread_self();
          fprintf(pFVar6,"P%lxT%lx - ",(long)_Var3,pVar4);
        }
        if (CMtrace_timing != 0) {
          clock_gettime(1,(timespec *)&ts);
          fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
        }
        fprintf((FILE *)cm->CMTrace_file,"That was the last one, Signalling %d\n",
                (ulong)(uint)p_Var1->deploy_ack_condition);
      }
      fflush((FILE *)cm->CMTrace_file);
      iVar2 = CMtrace_val[0xd];
      if (cm->CMTrace_file == (FILE *)0x0) {
        iVar2 = CMtrace_init(cm,EVdfgVerbose);
      }
      if (iVar2 != 0) {
        if (CMtrace_PID != 0) {
          pFVar6 = (FILE *)cm->CMTrace_file;
          _Var3 = getpid();
          pVar4 = pthread_self();
          fprintf(pFVar6,"P%lxT%lx - ",(long)_Var3,pVar4);
        }
        if (CMtrace_timing != 0) {
          clock_gettime(1,(timespec *)&ts);
          fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
        }
        fprintf((FILE *)cm->CMTrace_file,"EVDFG exit deploy ack handler -  master DFG state is %s\n"
                ,str_state[master->state]);
      }
      fflush((FILE *)cm->CMTrace_file);
      CMCondition_signal(cm,master->dfg->deploy_ack_condition);
      master->dfg->deploy_ack_condition = -1;
      if (master->state != DFG_Starting) {
        __assert_fail("master->state == DFG_Starting",
                      "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/ev_dfg.c"
                      ,0x9c6,"void handle_deploy_ack(EVmaster, EVmaster_msg_ptr)");
      }
      master->state = DFG_Running;
      iVar2 = CMtrace_val[0xd];
      if (cm->CMTrace_file == (FILE *)0x0) {
        iVar2 = CMtrace_init(cm,EVdfgVerbose);
      }
      if (iVar2 != 0) {
        if (CMtrace_PID != 0) {
          pFVar6 = (FILE *)cm->CMTrace_file;
          _Var3 = getpid();
          pVar4 = pthread_self();
          fprintf(pFVar6,"P%lxT%lx - ",(long)_Var3,pVar4);
        }
        if (CMtrace_timing != 0) {
          clock_gettime(1,(timespec *)&ts);
          fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
        }
        pFVar6 = (FILE *)cm->CMTrace_file;
        pcVar5 = str_state[master->state];
        __format = "EVDFG  -  master DFG state set to %s\n";
LAB_00146fea:
        fprintf(pFVar6,__format,pcVar5);
      }
    }
  }
  else {
    if (master->state != DFG_Reconfiguring) goto LAB_00146ffd;
    iVar2 = CMtrace_val[0xd];
    if (cm->CMTrace_file == (FILE *)0x0) {
      iVar2 = CMtrace_init(cm,EVdfgVerbose);
    }
    if (iVar2 != 0) {
      if (CMtrace_PID != 0) {
        pFVar6 = (FILE *)cm->CMTrace_file;
        _Var3 = getpid();
        pVar4 = pthread_self();
        fprintf(pFVar6,"P%lxT%lx - ",(long)_Var3,pVar4);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,(timespec *)&ts);
        fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
      }
      fprintf((FILE *)cm->CMTrace_file,
              "EVDFG reconfiguration in progress.  Deploy ack count %d, -  master DFG state set remains %s\n"
              ,(ulong)(uint)master->dfg->deploy_ack_count,str_state[master->state]);
    }
  }
  fflush((FILE *)cm->CMTrace_file);
LAB_00146ffd:
  iVar2 = CMtrace_val[0xd];
  if (cm->CMTrace_file == (FILE *)0x0) {
    iVar2 = CMtrace_init(cm,EVdfgVerbose);
  }
  if (iVar2 != 0) {
    if (CMtrace_PID != 0) {
      pFVar6 = (FILE *)cm->CMTrace_file;
      _Var3 = getpid();
      pVar4 = pthread_self();
      fprintf(pFVar6,"P%lxT%lx - ",(long)_Var3,pVar4);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,(timespec *)&ts);
      fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
    }
    fprintf((FILE *)cm->CMTrace_file,"EVDFG exit deploy ack handler -  master DFG state is %s\n",
            str_state[master->state]);
  }
  fflush((FILE *)cm->CMTrace_file);
  return;
}

Assistant:

static void
handle_deploy_ack(EVmaster master, EVmaster_msg_ptr mmsg)
{
    EVdeploy_ack_ptr msg =  &mmsg->u.deploy_ack;
    CManager cm = master->cm;
    EVdfg dfg = master->dfg;
    master->dfg->deploy_ack_count++;
    CMtrace_out(cm, EVdfgVerbose, "Client %s reports deployed, count %d\n", msg->node_id, master->dfg->deploy_ack_count);
    if ((master->dfg->deploy_ack_count == dfg->master->node_count) && (dfg->deploy_ack_condition != -1)) {
	CMtrace_out(cm, EVdfgVerbose, "That was the last one, Signalling %d\n", dfg->deploy_ack_condition);
	CMtrace_out(cm, EVdfgVerbose, "EVDFG exit deploy ack handler -  master DFG state is %s\n", str_state[master->state]);
	CMCondition_signal(cm, master->dfg->deploy_ack_condition);
	master->dfg->deploy_ack_condition = -1;
	assert(master->state == DFG_Starting);
	master->state = DFG_Running;
	CMtrace_out(cm, EVdfgVerbose, "EVDFG  -  master DFG state set to %s\n", str_state[master->state]);
    } else {
      if (master->state == DFG_Reconfiguring) {
	  if (master->dfg->deploy_ack_count == dfg->master->node_count) {
	      master->state = DFG_Running;
	      CMtrace_out(cm, EVdfgVerbose, "EVDFG after reconfiguration -  master DFG state set to %s\n", str_state[master->state]);
	  } else {
	      CMtrace_out(cm, EVdfgVerbose, "EVDFG reconfiguration in progress.  Deploy ack count %d, -  master DFG state set remains %s\n", master->dfg->deploy_ack_count, 
			  str_state[master->state]);
	  }
      }
    }
    CMtrace_out(cm, EVdfgVerbose, "EVDFG exit deploy ack handler -  master DFG state is %s\n", str_state[master->state]);
}